

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EntityDestinationRecord.cpp
# Opt level: O1

void __thiscall
KDIS::DATA_TYPE::EntityDestinationRecord::Encode(EntityDestinationRecord *this,KDataStream *stream)

{
  (*(this->m_Entity).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[5])
            (&this->m_Entity);
  KDataStream::Write<unsigned_short>(stream,this->m_ui16DstCommsDvcID);
  KDataStream::Write(stream,this->m_ui8DstLineID);
  KDataStream::Write(stream,this->m_ui8DstPriority);
  KDataStream::Write(stream,this->m_ui8LnStCmd);
  KDataStream::Write(stream,this->m_uiPadding1);
  return;
}

Assistant:

void EntityDestinationRecord::Encode( KDataStream & stream ) const
{
    stream << KDIS_STREAM m_Entity
           << m_ui16DstCommsDvcID
           << m_ui8DstLineID
           << m_ui8DstPriority
           << m_ui8LnStCmd
           << m_uiPadding1;
}